

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldf_process.cpp
# Opt level: O0

void __thiscall ldf::print(ldf *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  void *pvVar4;
  _Self local_20;
  _Self local_18;
  iterator it;
  ldf *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
       ::begin(&this->layer_definition);
  poVar2 = std::operator<<((ostream *)&std::cout,"Printing layer definition information.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"================= Start ================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>::
         end(&this->layer_definition);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Layer number = ");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_18);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,ppVar3->first);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Name         = ");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_18);
    poVar2 = std::operator<<(poVar2,(string *)&ppVar3->second);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Thickness    = ");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_18);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,(ppVar3->second).thickness);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Order        = ");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_18);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,(ppVar3->second).order);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Mask         = ");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_18);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,(ppVar3->second).mask);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Film type    = ");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_18);
    poVar2 = std::operator<<(poVar2,(ppVar3->second).film_type);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Colour       = ");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator->(&local_18);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,(ppVar3->second).colour);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"----------------------------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_iterator<std::pair<const_int,_layer_data>_>::operator++(&local_18,0);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"================== End =================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ldf::print()
{
  auto it = layer_definition.begin();
  cout << "Printing layer definition information." << endl;
  cout << "================= Start ================" << endl;
  while (it != layer_definition.end()) {
    cout << "Layer number = " << it->first << endl;
    cout << "Name         = " << it->second.name << endl;
    cout << "Thickness    = " << it->second.thickness << endl;
    cout << "Order        = " << it->second.order << endl;
    cout << "Mask         = " << it->second.mask << endl;
    cout << "Film type    = " << it->second.film_type << endl;
    cout << "Colour       = " << it->second.colour << endl;
    cout << "----------------------------------------" << endl;
    it++;
  }
  cout << "================== End =================" << endl;
}